

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O1

void GetQuadTreeVisibilityList(QuadTreeNode *TriTree,Level *Lvl,BoundingBox *ScrBounder)

{
  int iVar1;
  long lVar2;
  
  iVar1 = Separated(&TriTree->Bounder,ScrBounder);
  if (iVar1 == 0) {
    if (TriTree->Children == (QuadTreeNode *)0x0) {
      TriTree->Next = Lvl->VisibleList;
      Lvl->VisibleList = TriTree;
    }
    else {
      lVar2 = 0xd8;
      do {
        GetQuadTreeVisibilityList
                  ((QuadTreeNode *)((long)(TriTree->Children->Bounder).TL.Pos + lVar2),Lvl,
                   ScrBounder);
        lVar2 = lVar2 + -0x48;
      } while (lVar2 != -0x48);
    }
  }
  return;
}

Assistant:

static void GetQuadTreeVisibilityList(struct QuadTreeNode *TriTree,
                               struct Level *Lvl,
                               struct BoundingBox *ScrBounder)
{
   int c;

   /*

      if the view window doesn't overlap this node then do nothing

    */
   if (Separated(&TriTree->Bounder, ScrBounder))
      return;

   /*

      if this node has children, consider them instead

    */
   if (TriTree->Children) {
      c = 4;
      while (c--)
         GetQuadTreeVisibilityList(&TriTree->Children[c], Lvl, ScrBounder);
   } else {
      /*

         otherwise, add to draw list

       */
      TriTree->Next = Lvl->VisibleList;
      Lvl->VisibleList = TriTree;
   }
}